

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_strcmp_wildcard(char *wildcard,size_t wlen,char *check,size_t clen)

{
  char *pcVar1;
  int local_7c;
  int sp;
  char *cend;
  char *wc_end;
  char *wc [3];
  char *pcStack_48;
  char *match [3];
  size_t clen_local;
  char *check_local;
  size_t wlen_local;
  char *wildcard_local;
  
  pcVar1 = wildcard + wlen;
  local_7c = 0;
  clen_local = (size_t)check;
  wlen_local = (size_t)wildcard;
  do {
    if ((char *)wlen_local == pcVar1) {
      if (local_7c == 0) {
        return 1;
      }
      wlen_local = (size_t)wc[(long)(local_7c + -1) + -1];
      local_7c = local_7c + -1;
      clen_local = (size_t)match[(long)local_7c + -1];
    }
    else if (*(char *)wlen_local == '*') {
      wlen_local = wlen_local + 1;
      if ((char *)wlen_local == pcVar1) {
        return 0;
      }
      if (local_7c == 3) {
        match[2] = (char *)clen;
        _lws_log(1,"%s: exceeds * stack\n","lws_strcmp_wildcard");
        return 1;
      }
      wc[(long)local_7c + -1] = (char *)wlen_local;
      match[(long)local_7c + -1] = (char *)(clen_local + 1);
      local_7c = local_7c + 1;
    }
    else if (*(char *)clen_local == *(char *)wlen_local) {
      if ((char *)wlen_local == pcVar1) {
        return 0;
      }
      wlen_local = wlen_local + 1;
      clen_local = clen_local + 1;
    }
    else {
      clen_local = clen_local + 1;
      if (local_7c == 0) {
        return 1;
      }
    }
    if (check + clen <= clen_local) {
      return (uint)((char *)wlen_local != pcVar1);
    }
  } while( true );
}

Assistant:

int
lws_strcmp_wildcard(const char *wildcard, size_t wlen, const char *check,
		    size_t clen)
{
	const char *match[3], *wc[3], *wc_end = wildcard + wlen,
		   *cend = check + clen;
	int sp = 0;

	do {

		if (wildcard == wc_end) {
			/*
			 * We reached the end of wildcard, but not of check,
			 * and the last thing in wildcard was not a * or we
			 * would have completed already... if we can rewind,
			 * let's try that...
			 */
			if (sp) {
				wildcard = wc[sp - 1];
				check = match[--sp];

				continue;
			}

			/* otherwise it's the end of the road for this one */

			return 1;
		}

		if (*wildcard == '*') {

			if (++wildcard == wc_end)
				 /*
				  * Wildcard ended on a *, so we know we will
				  * match unconditionally
				  */
				return 0;

			/*
			 * Now we need to stick wildcard here and see if there
			 * is any remaining match exists, for eg b of "a*b"
			 */

			if (sp == LWS_ARRAY_SIZE(match)) {
				lwsl_err("%s: exceeds * stack\n", __func__);
				return 1; /* we can't deal with it */
			}

			wc[sp] = wildcard;
			/* if we ever pop and come back here, pick up from +1 */
			match[sp++] = check + 1;
			continue;
		}

		if (*(check++) == *wildcard) {

			if (wildcard == wc_end)
				return 0;
			/*
			 * We're still compatible with wildcard... keep going
			 */
			wildcard++;

			continue;
		}

		if (!sp)
			/*
			 * We're just trying to match literals, and failed...
			 */
			return 1;

		/* we're looking for a post-* match... keep looking... */

	} while (check < cend);

	/*
	 * We reached the end of check, if also at end of wildcard we're OK
	 */

	return wildcard != wc_end;
}